

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O0

void __thiscall roaring::Roaring64Map::add(Roaring64Map *this,uint32_t x)

{
  undefined4 in_ESI;
  undefined8 in_RDI;
  Roaring64Map *unaff_retaddr;
  uint32_t in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  lookupOrCreateInner(unaff_retaddr,(uint32_t)((ulong)in_RDI >> 0x20));
  Roaring::add((Roaring *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  return;
}

Assistant:

void add(uint32_t x) { lookupOrCreateInner(0).add(x); }